

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTimeAccess.cpp
# Opt level: O2

long __thiscall bhf::ads::RTimeAccess::ShowLatency(RTimeAccess *this,uint32_t indexOffset)

{
  ostream *os;
  uint8_t cpuId;
  ulong uVar1;
  RTimeCpuSettings info;
  RTimeCpuSettings RStack_38;
  
  ReadCpuSettings(&RStack_38,this);
  os = std::operator<<((ostream *)&std::cout,"RTimeCpuSettings:\n");
  ::operator<<(os,&RStack_38);
  for (uVar1 = 0; uVar1 != 0x40; uVar1 = uVar1 + 1) {
    if ((RStack_38.affinityMask >> (uVar1 & 0x3f) & 1) != 0) {
      ShowLatency(this,indexOffset,(uint32_t)uVar1);
    }
  }
  return 0;
}

Assistant:

long RTimeAccess::ShowLatency(const uint32_t indexOffset) const
{
    const auto info = ReadCpuSettings();

    std::cout << "RTimeCpuSettings:\n" << info;
    for (uint8_t cpuId = 0; cpuId < 8 * sizeof(info.affinityMask); ++cpuId) {
        static_assert((8 * sizeof(info.affinityMask) < std::numeric_limits<decltype(cpuId)>::max()),
                      "cpuId is to small for affinityMask");
        if (info.affinityMask & (1ULL << cpuId)) {
            ShowLatency(indexOffset, cpuId);
        }
    }
    return 0;
}